

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O0

void agentf_callback(void *vctx,void *reply,int replylen)

{
  agentf *af;
  int replylen_local;
  void *reply_local;
  void *vctx_local;
  
  agentf_got_response((agentf *)vctx,reply,replylen);
  safefree(reply);
  agentf_try_forward((agentf *)vctx);
  return;
}

Assistant:

static void agentf_callback(void *vctx, void *reply, int replylen)
{
    agentf *af = (agentf *)vctx;

    agentf_got_response(af, reply, replylen);
    sfree(reply);

    /*
     * Now try to extract and send further messages from the channel's
     * input-side buffer.
     */
    agentf_try_forward(af);
}